

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

void __thiscall CStructure::emitlab(CStructure *this,char *iid,aint address,bool isRelocatable)

{
  uint local_1034;
  char local_1028 [8];
  char sn [2048];
  char warnTxt [2048];
  aint misalignment;
  bool isRelocatable_local;
  aint address_local;
  char *iid_local;
  CStructure *this_local;
  
  if (this->maxAlignment == 0) {
    local_1034 = 0;
  }
  else {
    local_1034 = -address & this->maxAlignment - 1U;
  }
  if (local_1034 != 0) {
    snprintf(sn + 0x7f8,0x800,
             "Struct %s did use ALIGN %d in definition, but here it is misaligned by %d bytes",
             this->naam,(ulong)(uint)this->maxAlignment,(ulong)local_1034);
    Warning(sn + 0x7f8,(char *)0x0,W_PASS3);
  }
  memset(local_1028,0,0x800);
  strcpy(local_1028,iid);
  InsertSingleStructLabel(true,local_1028,isRelocatable,address,false);
  strncat(local_1028,".",0x7ff);
  InsertStructSubLabels(local_1028,isRelocatable,this->mnf,address,false);
  return;
}

Assistant:

void CStructure::emitlab(char* iid, aint address, const bool isRelocatable) {
	const aint misalignment = maxAlignment ? ((-address) & (maxAlignment - 1)) : 0;
	if (misalignment) {
		// emitting in misaligned position (considering the ALIGN used to define this struct)
		char warnTxt[LINEMAX];
		SPRINTF3(warnTxt, LINEMAX,
					"Struct %s did use ALIGN %d in definition, but here it is misaligned by %d bytes",
					naam, maxAlignment, misalignment);
		Warning(warnTxt);
	}
	char sn[LINEMAX] { 0 };
	STRCPY(sn, LINEMAX-1, iid);
	InsertSingleStructLabel(true, sn, isRelocatable, address, false);
	STRCAT(sn, LINEMAX-1, ".");
	InsertStructSubLabels(sn, isRelocatable, mnf, address, false);
}